

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

void __thiscall helics::FederateInfo::FederateInfo(FederateInfo *this,int argc,char **argv)

{
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char **argv_00;
  FederateInfo *this_01;
  CoreFederateInfo *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  int argc_00;
  
  CoreFederateInfo::CoreFederateInfo(in_stack_ffffffffffffff80);
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined1 *)(in_RDI + 0x4c) = 0x2f;
  *(undefined1 *)(in_RDI + 0x4d) = 0;
  *(undefined1 *)(in_RDI + 0x4e) = 0;
  *(undefined1 *)(in_RDI + 0x4f) = 0;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x58) = 0;
  *(undefined1 *)(in_RDI + 0x59) = 0;
  *(undefined1 *)(in_RDI + 0x5a) = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffff90);
  std::__cxx11::string::string(in_stack_ffffffffffffff90);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xa0);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  argv_00 = (char **)(in_RDI + 0x120);
  std::__cxx11::string::string(this_00);
  argc_00 = (int)((ulong)(in_RDI + 0x140) >> 0x20);
  std::__cxx11::string::string(this_00);
  this_01 = (FederateInfo *)(in_RDI + 0x160);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  *(undefined1 *)(in_RDI + 0x1a0) = 0;
  loadInfoFromArgsIgnoreOutput(this_01,argc_00,argv_00);
  return;
}

Assistant:

FederateInfo::FederateInfo(int argc, char* argv[])
{
    loadInfoFromArgsIgnoreOutput(argc, argv);
}